

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

void __thiscall
SEIUnit::serialize_buffering_period_message
          (SEIUnit *this,SPSUnit *sps,BitStreamWriter *writer,bool seiHeader)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  ulong uStack_48;
  uint msgLen;
  size_t SchedSelIdx_1;
  size_t SchedSelIdx;
  uint beforeMessageLen;
  uint8_t *size;
  bool seiHeader_local;
  BitStreamWriter *writer_local;
  SPSUnit *sps_local;
  SEIUnit *this_local;
  
  if (seiHeader) {
    BitStreamWriter::putBits(writer,8,6);
    BitStreamWriter::putBits(writer,8,0);
  }
  puVar4 = BitStream::getBuffer(&writer->super_BitStream);
  iVar1 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,8,0);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  NALUnit::writeUEGolombCode(writer,sps->seq_parameter_set_id);
  if (((sps->nalHrdParams).isPresent & 1U) != 0) {
    for (SchedSelIdx_1 = 0; SchedSelIdx_1 <= (sps->nalHrdParams).cpb_cnt_minus1;
        SchedSelIdx_1 = SchedSelIdx_1 + 1) {
      BitStreamWriter::putBits
                (writer,(sps->nalHrdParams).initial_cpb_removal_delay_length_minus1 + 1,
                 this->initial_cpb_removal_delay[SchedSelIdx_1]);
      BitStreamWriter::putBits
                (writer,(sps->nalHrdParams).initial_cpb_removal_delay_length_minus1 + 1,
                 this->initial_cpb_removal_delay_offset[SchedSelIdx_1]);
    }
  }
  if (((sps->vclHrdParams).isPresent & 1U) != 0) {
    for (uStack_48 = 0; uStack_48 <= (sps->vclHrdParams).cpb_cnt_minus1; uStack_48 = uStack_48 + 1)
    {
      BitStreamWriter::putBits
                (writer,(sps->vclHrdParams).initial_cpb_removal_delay_length_minus1 + 1,
                 this->initial_cpb_removal_delay[uStack_48]);
      BitStreamWriter::putBits
                (writer,(sps->vclHrdParams).initial_cpb_removal_delay_length_minus1 + 1,
                 this->initial_cpb_removal_delay_offset[uStack_48]);
    }
  }
  NALUnit::write_byte_align_bits(writer);
  iVar3 = BitStreamWriter::getBitsCount(writer);
  puVar4[iVar1 / 8] = (uint8_t)((uint)(iVar3 - iVar2) >> 3);
  if (seiHeader) {
    NALUnit::write_rbsp_trailing_bits(writer);
  }
  return;
}

Assistant:

void SEIUnit::serialize_buffering_period_message(const SPSUnit& sps, BitStreamWriter& writer,
                                                 const bool seiHeader) const
{
    if (seiHeader)
    {
        writer.putBits(8, static_cast<int>(NALType::nuSEI));
        writer.putBits(8, SEI_MSG_BUFFERING_PERIOD);
    }
    uint8_t* size = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);
    const unsigned beforeMessageLen = writer.getBitsCount();

    // buffering period
    writeUEGolombCode(writer, sps.seq_parameter_set_id);
    if (sps.nalHrdParams.isPresent)
    {  // NalHrdBpPresentFlag
        for (size_t SchedSelIdx = 0; SchedSelIdx <= sps.nalHrdParams.cpb_cnt_minus1; SchedSelIdx++)
        {
            writer.putBits(sps.nalHrdParams.initial_cpb_removal_delay_length_minus1 + 1,
                           initial_cpb_removal_delay[SchedSelIdx]);
            writer.putBits(sps.nalHrdParams.initial_cpb_removal_delay_length_minus1 + 1,
                           initial_cpb_removal_delay_offset[SchedSelIdx]);
        }
    }
    if (sps.vclHrdParams.isPresent)
    {  // vclHrdBpPresentFlag
        for (size_t SchedSelIdx = 0; SchedSelIdx <= sps.vclHrdParams.cpb_cnt_minus1; SchedSelIdx++)
        {
            writer.putBits(sps.vclHrdParams.initial_cpb_removal_delay_length_minus1 + 1,
                           initial_cpb_removal_delay[SchedSelIdx]);
            writer.putBits(sps.vclHrdParams.initial_cpb_removal_delay_length_minus1 + 1,
                           initial_cpb_removal_delay_offset[SchedSelIdx]);
        }
    }
    write_byte_align_bits(writer);
    // ---------
    const unsigned msgLen = writer.getBitsCount() - beforeMessageLen;
    *size = static_cast<uint8_t>(msgLen / 8);

    if (seiHeader)
        write_rbsp_trailing_bits(writer);
}